

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

void __thiscall
ska::detailv3::sherwood_v3_table<$b062436f$>::clear(sherwood_v3_table<_b062436f_> *this)

{
  EntryPointer this_00;
  long lVar1;
  
  this_00 = this->entries;
  for (lVar1 = (long)this->max_lookups * 0x30 + this->num_slots_minus_one * 0x30; lVar1 != 0;
      lVar1 = lVar1 + -0x30) {
    if (-1 < this_00->distance_from_desired) {
      sherwood_v3_entry<std::pair<const_slang::ast::PackageSymbol_*,_ska::flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>_>
      ::destroy_value(this_00);
    }
    this_00 = this_00 + 1;
  }
  this->num_elements = 0;
  return;
}

Assistant:

[[clang::reinitializes]]
    void clear()
    {
        for (EntryPointer it = entries, end = it + static_cast<ptrdiff_t>(num_slots_minus_one + max_lookups); it != end; ++it)
        {
            if (it->has_value())
                it->destroy_value();
        }
        num_elements = 0;
    }